

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_blancer.hpp
# Opt level: O2

int __thiscall
coro_io::load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool>::WRRLoadBlancer::
select_host_with_weight_round_robin(WRRLoadBlancer *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  int iVar7;
  int iVar9;
  int iVar10;
  ulong uVar8;
  
  piVar2 = (this->weights_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->weights_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar8 = (ulong)(uint)this->wrr_current_;
  iVar1 = this->max_weight_;
  iVar9 = this->weight_current_;
  do {
    auVar5._8_4_ = 0;
    auVar5._0_8_ = (long)piVar3 - (long)piVar2 >> 2;
    auVar6._8_4_ = 0;
    auVar6._0_8_ = (long)((int)uVar8 + 1);
    uVar8 = SUB128(auVar6 % auVar5,0);
    iVar7 = SUB124(auVar6 % auVar5,0);
    this->wrr_current_ = iVar7;
    if (iVar7 == 0) {
      iVar10 = iVar9 - this->max_gcd_;
      this->weight_current_ = iVar10;
      bVar4 = iVar9 < this->max_gcd_;
      iVar9 = iVar10;
      if ((iVar10 == 0 || bVar4) && (this->weight_current_ = iVar1, iVar9 = iVar1, iVar1 == 0)) {
        return -1;
      }
    }
    if (iVar9 <= piVar2[iVar7]) {
      return iVar7;
    }
  } while( true );
}

Assistant:

int select_host_with_weight_round_robin() {
      while (true) {
        wrr_current_ = (wrr_current_ + 1) % weights_.size();
        if (wrr_current_ == 0) {
          weight_current_ = weight_current_ - max_gcd_;
          if (weight_current_ <= 0) {
            weight_current_ = max_weight_;
            if (weight_current_ == 0) {
              return -1;  // can't find max weight server
            }
          }
        }

        if (weights_[wrr_current_] >= weight_current_) {
          return wrr_current_;
        }
      }
    }